

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

void __thiscall LexicalAnalyzer::CutLine(LexicalAnalyzer *this)

{
  int i;
  ulong uVar1;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)this);
  for (uVar1 = 0; uVar1 < (this->source)._M_string_length; uVar1 = uVar1 + 1) {
    if ((this->source)._M_dataplus._M_p[uVar1] == '\n') {
      if (line._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->lines,&line);
        line._M_string_length = 0;
        *line._M_dataplus._M_p = '\0';
      }
    }
    else {
      std::__cxx11::string::push_back((char)&line);
    }
  }
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void LexicalAnalyzer::CutLine() {
    std::string line;
    source += '\n';//Add an '\n' at the end of file
    for (int i = 0; i < source.size(); i++) {
        if (source[i] != '\n') {
            line += source[i];
        } else {
            if (!line.empty()) {
                lines.push_back(line);
                line.clear();
            }
        }
    }
}